

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::LocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CPalString *psObjectToLocate,
          CAllowedObjectTypes *paot,IPalObject **ppobj)

{
  bool bVar1;
  int iVar2;
  PAL_ERROR PVar3;
  size_t sVar4;
  CSharedMemoryObject *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SHMPTR shmptr;
  SHMObjData *psmod;
  char16_t *string1;
  PLIST_ENTRY ple;
  CPalThread *pThread;
  char *__format;
  WCHAR *string;
  undefined1 local_78 [8];
  CObjectAttributes oa;
  CSharedMemoryObject *local_50;
  CSharedMemoryObject *pshmobj;
  IPalObject **local_40;
  CPalThread *local_38;
  undefined8 *puVar6;
  
  pshmobj = (CSharedMemoryObject *)paot;
  local_40 = ppobj;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x202);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (psObjectToLocate == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x203);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate\n");
  }
  string = psObjectToLocate->m_pwsz;
  if (string == (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x204);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate->GetString()\n");
    string = psObjectToLocate->m_pwsz;
  }
  sVar4 = PAL_wcslen(string);
  if (sVar4 != psObjectToLocate->m_dwStringLength) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x205);
    fprintf(_stderr,
            "Expression: PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength()\n"
           );
  }
  if (local_40 == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x206);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)&this->m_csListLock;
  local_38 = pthr;
  InternalEnterCriticalSection(pthr,(PCRITICAL_SECTION)oa.pSecurityAttributes);
  ple = &this->m_leNamedObjects;
  do {
    ple = ple->Flink;
    if (ple == &this->m_leNamedObjects) {
      pCVar5 = (CSharedMemoryObject *)0x0;
      break;
    }
    pCVar5 = CSharedMemoryObject::GetObjectFromListLink(ple);
    iVar2 = (*(pCVar5->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[1])(pCVar5);
    puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    if (puVar6 == (undefined8 *)0x0) {
      fprintf(_stderr,"] %s %s:%d","LocateObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x223);
      fprintf(_stderr,"Expression: NULL != poa\n");
    }
  } while ((*(DWORD *)(puVar6 + 1) != psObjectToLocate->m_dwStringLength) ||
          (iVar2 = PAL_wcscmp((char16_t *)*puVar6,psObjectToLocate->m_pwsz), iVar2 != 0));
  if (pCVar5 == (CSharedMemoryObject *)0x0) {
    SHMLock();
    shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
    PVar3 = 0x7b;
    while (shmptr != 0) {
      psmod = (SHMObjData *)SHMPtrToPtr(shmptr);
      if (psmod == (SHMObjData *)0x0) {
        fprintf(_stderr,"] %s %s:%d","LocateObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x279);
        __format = "Unable to map shmObjectListEntry\n";
LAB_001fd865:
        fprintf(_stderr,__format);
        break;
      }
      if (psmod->dwNameLength == psObjectToLocate->m_dwStringLength) {
        string1 = (char16_t *)SHMPtrToPtr(psmod->shmObjName);
        if (string1 == (char16_t *)0x0) {
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x270);
          __format = "Unable to map psmod->shmObjName\n";
          goto LAB_001fd865;
        }
        iVar2 = PAL_wcscmp(string1,psObjectToLocate->m_pwsz);
        if (iVar2 == 0) {
          local_50 = (CSharedMemoryObject *)0x0;
          CObjectAttributes::CObjectAttributes
                    ((CObjectAttributes *)local_78,string1,(LPSECURITY_ATTRIBUTES)0x0);
          bVar1 = CAllowedObjectTypes::IsTypeAllowed((CAllowedObjectTypes *)pshmobj,psmod->eTypeId);
          if (!bVar1) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
            PVar3 = 6;
            break;
          }
          if (CObjectType::s_rgotIdMapping[psmod->eTypeId] == (CObjectType *)0x0) {
            fprintf(_stderr,"] %s %s:%d","LocateObject",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                    ,0x295);
            fprintf(_stderr,"Invalid object type ID in shared memory info\n");
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
            PVar3 = ImportSharedObjectIntoProcess
                              (this,local_38,CObjectType::s_rgotIdMapping[psmod->eTypeId],
                               (CObjectAttributes *)local_78,shmptr,psmod,true,&local_50);
            if (PVar3 != 0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
              break;
            }
            *local_40 = (IPalObject *)local_50;
          }
          PVar3 = 0;
          break;
        }
      }
      shmptr = psmod->shmNextObj;
    }
    pThread = local_38;
    SHMRelease();
  }
  else {
    iVar2 = (**(pCVar5->super_CPalObjectBase).super_IPalObject._vptr_IPalObject)(pCVar5);
    bVar1 = CAllowedObjectTypes::IsTypeAllowed
                      ((CAllowedObjectTypes *)pshmobj,
                       *(PalObjectTypeId *)CONCAT44(extraout_var_00,iVar2));
    pThread = local_38;
    if (bVar1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
      (*(pCVar5->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[7])(pCVar5);
      *local_40 = (IPalObject *)pCVar5;
      PVar3 = 0;
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fd99d;
      PVar3 = 6;
    }
  }
  InternalLeaveCriticalSection(pThread,(PCRITICAL_SECTION)oa.pSecurityAttributes);
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar3;
  }
LAB_001fd99d:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::LocateObject(
    CPalThread *pthr,
    CPalString *psObjectToLocate,
    CAllowedObjectTypes *paot,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjExisting = NULL;
    SHMPTR shmSharedObjectData = SHMNULL;
    SHMPTR shmObjectListEntry = SHMNULL;
    SHMObjData *psmod = NULL;
    LPWSTR pwsz = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != psObjectToLocate);
    _ASSERTE(NULL != psObjectToLocate->GetString());
    _ASSERTE(PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength());
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::LocateObject "
        "(this=%p, pthr=%p, psObjectToLocate=%p, paot=%p, "
        "ppobj=%p)\n",
        this,
        pthr,
        psObjectToLocate,
        paot,
        ppobj
        );

    TRACE("Searching for object name %S\n", psObjectToLocate->GetString());

    InternalEnterCriticalSection(pthr, &m_csListLock);

    //
    // Search the local named object list for this object
    //

    for (PLIST_ENTRY ple = m_leNamedObjects.Flink;
         ple != &m_leNamedObjects;
         ple = ple->Flink)
    {
        CObjectAttributes *poa;
        CSharedMemoryObject *pshmobj =
            CSharedMemoryObject::GetObjectFromListLink(ple);

        poa = pshmobj->GetObjectAttributes();
        _ASSERTE(NULL != poa);

        if (poa->sObjectName.GetStringLength() != psObjectToLocate->GetStringLength())
        {
            continue;
        }

        if (0 != PAL_wcscmp(poa->sObjectName.GetString(), psObjectToLocate->GetString()))
        {
            continue;
        }

        //
        // This object has the name we're looking for
        //

        pobjExisting = static_cast<IPalObject*>(pshmobj);
        break;        
    } 

    if (NULL != pobjExisting)
    {
        //
        //  Validate the located object's type
        //

        if (paot->IsTypeAllowed(
                pobjExisting->GetObjectType()->GetId()
                ))
        {
            TRACE("Local object exists with compatible type\n");
            
            //
            // Add a reference to the found object
            //

            pobjExisting->AddReference();
            *ppobj = pobjExisting;
        }
        else
        {
            TRACE("Local object exists w/ incompatible type\n");            
            palError = ERROR_INVALID_HANDLE;
        }
        
        goto LocateObjectExit;
    }

    //
    // Search the shared memory named object list for a matching object
    //
    
    SHMLock();
    
    shmObjectListEntry = SHMGetInfo(SIID_NAMED_OBJECTS);
    while (SHMNULL != shmObjectListEntry)
    {
        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListEntry);
        if (NULL != psmod)
        {
            if (psmod->dwNameLength == psObjectToLocate->GetStringLength())
            {
                pwsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
                if (NULL != pwsz)
                {
                    if (0 == PAL_wcscmp(pwsz, psObjectToLocate->GetString()))
                    {
                        //
                        // This is the object we were looking for.
                        //

                        shmSharedObjectData = shmObjectListEntry;
                        break;
                    }
                }
                else
                {
                    ASSERT("Unable to map psmod->shmObjName\n");
                    break;
                }                
            }

            shmObjectListEntry = psmod->shmNextObj;
        }
        else
        {
            ASSERT("Unable to map shmObjectListEntry\n");
            break;
        }
    }

    if (SHMNULL != shmSharedObjectData)
    {
        CSharedMemoryObject *pshmobj = NULL;
        CObjectAttributes oa(pwsz, NULL);

        //
        // Check if the type is allowed
        //

        if (!paot->IsTypeAllowed(psmod->eTypeId))
        {
            TRACE("Remote object exists w/ incompatible type\n");
            palError = ERROR_INVALID_HANDLE;
            goto LocateObjectExitSHMRelease;
        }
        
        //
        // Get the local instance of the CObjectType
        //
        
        CObjectType *pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto LocateObjectExitSHMRelease;
        }

        TRACE("Remote object exists compatible type -- importing\n");
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            shmSharedObjectData,
            psmod,
            TRUE,
            &pshmobj
            );

        if (NO_ERROR == palError)
        {   
            *ppobj = static_cast<IPalObject*>(pshmobj);
        }
        else
        {
            ERROR("Failure initializing object from shared data\n");
            goto LocateObjectExitSHMRelease;
        }
        
    }
    else
    {
        //
        // The object was not found
        //

        palError = ERROR_INVALID_NAME;
    }

LocateObjectExitSHMRelease:

    SHMRelease();

LocateObjectExit:

    InternalLeaveCriticalSection(pthr, &m_csListLock);

    LOGEXIT("CSharedMemoryObjectManager::LocateObject returns %d\n", palError);

    return palError;
}